

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_delete_nonexist_single(planck_unit_test_t *tc)

{
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_none);
  local_84 = 5;
  local_88 = 10;
  bhdct_insert(tc,&dict,&local_84,&local_88,'\x01');
  local_8c = 3;
  bhdct_delete(tc,&dict,&local_8c,'\x01',0,'\x01');
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_delete_nonexist_single(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(5, int), IONIZE(10, int), boolean_true);
	bhdct_delete(tc, &dict, IONIZE(3, int), err_item_not_found, 0, boolean_true);

	bhdct_takedown(tc, &dict);
}